

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::
Shape*,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,Block *Target,FlowType Type,Shape *Ancestor,BlockSet *From)

{
  Branch *pBVar1;
  bool bVar2;
  reference ppBVar3;
  Branch **ppBVar4;
  Branch *PriorOut;
  Block *local_48;
  Block *Prior;
  _Self local_38;
  iterator iter;
  BlockSet *From_local;
  Shape *Ancestor_local;
  Block *pBStack_18;
  FlowType Type_local;
  Block *Target_local;
  Analyzer *this_local;
  
  iter._M_node = (_List_node_base *)From;
  pBStack_18 = Target;
  Target_local = (Block *)this;
  local_38._M_node =
       (_List_node_base *)::wasm::InsertOrderedSet<CFG::Block_*>::begin(&Target->BranchesIn);
  while( true ) {
    Prior = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(&pBStack_18->BranchesIn);
    bVar2 = std::operator!=(&local_38,(_Self *)&Prior);
    if (!bVar2) break;
    ppBVar3 = std::_List_iterator<CFG::Block_*>::operator*(&local_38);
    local_48 = *ppBVar3;
    bVar2 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>
                      ((InsertOrderedSet<CFG::Block_*> *)iter._M_node,&local_48);
    if (bVar2) {
      ppBVar4 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                          (&local_48->BranchesOut,&stack0xffffffffffffffe8);
      pBVar1 = *ppBVar4;
      pBVar1->Ancestor = Ancestor;
      pBVar1->Type = Type;
      std::_List_iterator<CFG::Block_*>::operator++(&local_38,0);
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(&pBStack_18->BranchesIn,&local_48);
      ::wasm::InsertOrderedSet<CFG::Block_*>::insert(&pBStack_18->ProcessedBranchesIn,&local_48);
      ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::erase
                (&local_48->BranchesOut,&stack0xffffffffffffffe8);
      ppBVar4 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                          (&local_48->ProcessedBranchesOut,&stack0xffffffffffffffe8);
      *ppBVar4 = pBVar1;
    }
    else {
      std::_List_iterator<CFG::Block_*>::operator++(&local_38,0);
    }
  }
  return;
}

Assistant:

void Solipsize(Block* Target,
                   Branch::FlowType Type,
                   Shape* Ancestor,
                   BlockSet& From) {
      PrintDebug("Solipsizing branches into %d\n", Target->Id);
      DebugDump(From, "  relevant to solipsize: ");
      for (auto iter = Target->BranchesIn.begin();
           iter != Target->BranchesIn.end();) {
        Block* Prior = *iter;
        if (!contains(From, Prior)) {
          iter++;
          continue;
        }
        Branch* PriorOut = Prior->BranchesOut[Target];
        PriorOut->Ancestor = Ancestor;
        PriorOut->Type = Type;
        iter++; // carefully increment iter before erasing
        Target->BranchesIn.erase(Prior);
        Target->ProcessedBranchesIn.insert(Prior);
        Prior->BranchesOut.erase(Target);
        Prior->ProcessedBranchesOut[Target] = PriorOut;
        PrintDebug("  eliminated branch from %d\n", Prior->Id);
      }
    }